

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O2

bool __thiscall
bssl::ParseCrlDistributionPoints
          (bssl *this,Input extension_value,
          vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
          *distribution_points)

{
  _Head_base<0UL,_bssl::GeneralNames_*,_false> __p;
  bool bVar1;
  Input input;
  Input general_names_value;
  CertErrors errors;
  optional<bssl::der::Input> der_full_name;
  ParsedDistributionPoint distribution_point;
  Parser distribution_points_parser;
  Parser extension_value_parser;
  Parser distrib_point_parser;
  Parser parser;
  _Head_base<0UL,_bssl::GeneralNames_*,_false> local_130;
  _Storage<bssl::der::Input,_true> local_128;
  char local_118;
  CertErrors local_110;
  _Storage<bssl::der::Input,_true> local_f8;
  char local_e8;
  ParsedDistributionPoint local_e0;
  Parser local_90;
  Parser local_78;
  Parser local_60;
  Parser local_48;
  
  ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>::
  clear((vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_> *)
        extension_value.data_.size_);
  input.data_.size_ = (size_t)extension_value.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_78,input);
  der::Parser::Parser(&local_90);
  bVar1 = der::Parser::ReadSequence(&local_78,&local_90);
  if (((!bVar1) || (bVar1 = der::Parser::HasMore(&local_78), bVar1)) ||
     (bVar1 = der::Parser::HasMore(&local_90), !bVar1)) {
LAB_0037dcfd:
    bVar1 = false;
  }
  else {
    while (bVar1 = der::Parser::HasMore(&local_90), bVar1) {
      local_e0.distribution_point_fullname._M_t.
      super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>._M_t.
      super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>.
      super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl =
           (__uniq_ptr_data<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>,_true,_true>
           )(__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)0x0;
      local_e0.distribution_point_name_relative_to_crl_issuer.
      super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
      local_e0.reasons.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
      local_e0.crl_issuer.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
      der::Parser::Parser(&local_60);
      bVar1 = der::Parser::ReadSequence(&local_90,&local_60);
      if (!bVar1) {
LAB_0037dcf3:
        ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::~unique_ptr
                  (&local_e0.distribution_point_fullname);
        goto LAB_0037dcfd;
      }
      local_118 = '\0';
      bVar1 = der::Parser::ReadOptionalTag
                        (&local_60,0xa0000000,(optional<bssl::der::Input> *)&local_128._M_value);
      if (!bVar1) goto LAB_0037dcf3;
      if (local_118 == '\x01') {
        der::Parser::Parser(&local_48,local_128._M_value.data_);
        local_e8 = '\0';
        bVar1 = der::Parser::ReadOptionalTag
                          (&local_48,0xa0000000,(optional<bssl::der::Input> *)&local_f8._M_value);
        if (bVar1) {
          if (local_e8 == '\x01') {
            CertErrors::CertErrors(&local_110);
            general_names_value.data_.size_ = (size_t)local_f8._M_value.data_.data_;
            general_names_value.data_.data_ = (uchar *)&local_130;
            GeneralNames::CreateFromValue
                      (general_names_value,(CertErrors *)local_f8._M_value.data_.size_);
            __p._M_head_impl = local_130._M_head_impl;
            local_130._M_head_impl = (pointer)0x0;
            ::std::__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
            reset((__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> *)
                  &local_e0,__p._M_head_impl);
            ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
            ~unique_ptr((unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> *)
                        &local_130);
            if (local_e0.distribution_point_fullname._M_t.
                super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>.
                _M_t.
                super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)0x0)
            {
              CertErrors::~CertErrors(&local_110);
            }
            else {
              bVar1 = der::Parser::HasMore(&local_48);
              CertErrors::~CertErrors(&local_110);
joined_r0x0037dc7f:
              if (!bVar1) goto LAB_0037dc81;
            }
          }
          else {
            bVar1 = der::Parser::ReadOptionalTag
                              (&local_48,0xa0000001,
                               &local_e0.distribution_point_name_relative_to_crl_issuer);
            if ((bVar1) &&
               (local_e0.distribution_point_name_relative_to_crl_issuer.
                super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                super__Optional_payload_base<bssl::der::Input>._M_engaged == true)) {
              bVar1 = der::Parser::HasMore(&local_48);
              goto joined_r0x0037dc7f;
            }
          }
        }
        goto LAB_0037dcf3;
      }
LAB_0037dc81:
      bVar1 = der::Parser::ReadOptionalTag(&local_60,0x80000001,&local_e0.reasons);
      if ((((!bVar1) ||
           (bVar1 = der::Parser::ReadOptionalTag(&local_60,0xa0000002,&local_e0.crl_issuer), !bVar1)
           ) || ((local_118 == '\0' &&
                 (local_e0.crl_issuer.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                  super__Optional_payload_base<bssl::der::Input>._M_engaged != true)))) ||
         (bVar1 = der::Parser::HasMore(&local_60), bVar1)) goto LAB_0037dcf3;
      ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>::
      emplace_back<bssl::ParsedDistributionPoint>
                ((vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                  *)extension_value.data_.size_,&local_e0);
      ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::~unique_ptr
                (&local_e0.distribution_point_fullname);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ParseCrlDistributionPoints(
    der::Input extension_value,
    std::vector<ParsedDistributionPoint> *distribution_points) {
  distribution_points->clear();

  // RFC 5280, section 4.2.1.13.
  //
  // CRLDistributionPoints ::= SEQUENCE SIZE (1..MAX) OF DistributionPoint
  der::Parser extension_value_parser(extension_value);
  der::Parser distribution_points_parser;
  if (!extension_value_parser.ReadSequence(&distribution_points_parser)) {
    return false;
  }
  if (extension_value_parser.HasMore()) {
    return false;
  }

  // Sequence must have a minimum of 1 item.
  if (!distribution_points_parser.HasMore()) {
    return false;
  }

  while (distribution_points_parser.HasMore()) {
    if (!ParseAndAddDistributionPoint(&distribution_points_parser,
                                      distribution_points)) {
      return false;
    }
  }

  return true;
}